

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

bool wildcardMatch(const_iterator str_first,const_iterator str_last,const_iterator p_first,
                  const_iterator p_last)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  
  do {
    while( true ) {
      if (str_first._M_current == str_last._M_current) {
        if (p_first._M_current == p_last._M_current) {
          return true;
        }
        if (*p_first._M_current == '*') {
          return p_first._M_current + 1 == p_last._M_current;
        }
      }
      if (p_first._M_current == p_last._M_current) {
        return false;
      }
      cVar1 = *p_first._M_current;
      if (cVar1 == 0x3f) break;
      iVar3 = tolower((int)cVar1);
      iVar4 = tolower((int)*str_first._M_current);
      if (iVar3 == iVar4) break;
      if (cVar1 != '*') {
        return false;
      }
      bVar2 = wildcardMatch((const_iterator)(str_first._M_current + 1),str_last,p_first,p_last);
      if (bVar2) {
        return true;
      }
      p_first._M_current = p_first._M_current + 1;
    }
    p_first._M_current = p_first._M_current + 1;
    str_first._M_current = str_first._M_current + 1;
  } while( true );
}

Assistant:

inline bool wildcardMatch(std::string::const_iterator str_first,
                          std::string::const_iterator str_last,
                          std::string::const_iterator p_first,
                          std::string::const_iterator p_last)
{
  if (str_first == str_last && p_first == p_last)
  { return true; }

  if (str_first == str_last)
  {
    if (*p_first == '*')
    {
      // if there is no more character after * => match
      return std::next(p_first) == p_last;
    }
  }

  if (p_first == p_last)
  {
    return false;
  }

  if (*p_first == '?' || std::tolower(*p_first) == std::tolower(*str_first))
  {
    return wildcardMatch(std::next(str_first), str_last,
                         std::next(p_first), p_last);
  }

  if (*p_first == '*')
  {
    return wildcardMatch(std::next(str_first), str_last, p_first, p_last) ||
           wildcardMatch(str_first, str_last, std::next(p_first), p_last);
  }

  return false;
}